

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReFinalize.cpp
# Opt level: O0

void __thiscall
wasm::ReFinalize::replaceUntaken(ReFinalize *this,Expression *value,Expression *condition)

{
  Drop *right;
  Expression *left;
  bool bVar1;
  Module *wasm;
  optional<wasm::Type> type;
  optional<wasm::Type> local_48;
  Builder local_38;
  Builder builder;
  Expression *replacement;
  Drop *local_20;
  Expression *condition_local;
  Expression *value_local;
  ReFinalize *this_local;
  
  replacement._4_4_ = 1;
  local_20 = (Drop *)condition;
  condition_local = value;
  value_local = (Expression *)this;
  bVar1 = wasm::Type::operator==(&value->type,(BasicType *)((long)&replacement + 4));
  if (!bVar1) {
    __assert_fail("value->type == Type::unreachable",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ReFinalize.cpp"
                  ,0xde,"void wasm::ReFinalize::replaceUntaken(Expression *, Expression *)");
  }
  builder.wasm = (Module *)condition_local;
  if (local_20 != (Drop *)0x0) {
    wasm = Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                       ).
                       super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                       .
                       super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                     );
    Builder::Builder(&local_38,wasm);
    bVar1 = wasm::Type::isConcrete
                      (&(local_20->super_SpecificExpression<(wasm::Expression::Id)18>).
                        super_Expression.type);
    if (bVar1) {
      local_20 = Builder::makeDrop(&local_38,(Expression *)local_20);
    }
    left = condition_local;
    right = local_20;
    std::optional<wasm::Type>::optional(&local_48);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._9_7_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload =
         local_48.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_payload;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_engaged =
         local_48.super__Optional_base<wasm::Type,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Type>._M_engaged;
    builder.wasm = (Module *)Builder::makeSequence(&local_38,left,(Expression *)right,type);
    bVar1 = wasm::Type::isBasic((Type *)&((builder.wasm)->exports).
                                         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
    if (!bVar1) {
      __assert_fail("replacement->type.isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/ReFinalize.cpp"
                    ,0xef,"void wasm::ReFinalize::replaceUntaken(Expression *, Expression *)");
    }
  }
  Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
              ).super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
              .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
             (Expression *)builder.wasm);
  return;
}

Assistant:

void ReFinalize::replaceUntaken(Expression* value, Expression* condition) {
  assert(value->type == Type::unreachable);
  auto* replacement = value;
  if (condition) {
    Builder builder(*getModule());
    // Even if we have
    //  (block
    //   (unreachable)
    //   (i32.const 1)
    //  )
    // we want the block type to be unreachable. That is valid as
    // the value is unreachable, and necessary since the type of
    // the condition did not have an impact before (the break/switch
    // type was unreachable), and might not fit in.
    if (condition->type.isConcrete()) {
      condition = builder.makeDrop(condition);
    }
    replacement = builder.makeSequence(value, condition);
    assert(replacement->type.isBasic() && "Basic type expected");
  }
  replaceCurrent(replacement);
}